

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchCreateCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr source;
  cmMakefile *this_00;
  string *config_00;
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  string *psVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  string pchHeader;
  string instantiateOption;
  string pchFile;
  string createOptVar;
  undefined1 local_108 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [16];
  _Rb_tree_node_base local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_58 = config;
  std::operator+(&local_88,language,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &local_88,arch);
  local_108._8_8_ = local_b8._8_8_;
  local_108._0_8_ = local_108 + 0x10;
  if ((_Rb_tree_node_base *)local_b8._0_8_ == &local_a8) {
    local_108._24_8_ = local_a8._M_parent;
  }
  else {
    local_108._0_8_ = local_b8._0_8_;
  }
  local_b8._8_8_ = (char *)0x0;
  local_a8._M_color._0_1_ = '\0';
  local_108._32_8_ = "";
  local_b8._0_8_ = &local_a8;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchCreateCompileOptions,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      *)local_108);
  _Var2 = pVar4.first._M_node;
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_88);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"PCH_WARN_INVALID",(allocator<char> *)local_b8);
    local_68 = arch;
    local_60 = __return_storage_ptr__;
    bVar1 = GetPropertyAsBool(this,(string *)local_108);
    source = _Var2._M_node + 2;
    std::__cxx11::string::~string((string *)local_108);
    if (bVar1) {
      this_00 = this->Makefile;
      local_108._0_8_ = &DAT_00000006;
      local_108._8_8_ = "CMAKE_";
      local_b8._8_8_ = (language->_M_dataplus)._M_p;
      local_b8._0_8_ = language->_M_string_length;
      cmStrCat<char[29]>(&local_88,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,
                         (char (*) [29])"_COMPILE_OPTIONS_INVALID_PCH");
      cmMakefile::GetSafeDefinition(this_00,&local_88);
      std::__cxx11::string::_M_assign((string *)source);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"PCH_INSTANTIATE_TEMPLATES",(allocator<char> *)local_b8);
    bVar1 = GetPropertyAsBool(this,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    if (bVar1) {
      local_108._0_8_ = &DAT_00000006;
      local_108._8_8_ = "CMAKE_";
      local_b8._8_8_ = (language->_M_dataplus)._M_p;
      local_b8._0_8_ = language->_M_string_length;
      cmStrCat<char[43]>(&local_88,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,
                         (char (*) [43])"_COMPILE_OPTIONS_INSTANTIATE_TEMPLATES_PCH");
      psVar3 = cmMakefile::GetSafeDefinition(this->Makefile,&local_88);
      std::__cxx11::string::string((string *)&local_d8,(string *)psVar3);
      if (local_d8._M_string_length != 0) {
        local_108._8_8_ = *(undefined8 *)(_Var2._M_node + 2);
        local_108._0_8_ = _Var2._M_node[2]._M_parent;
        local_b8._0_8_ = &DAT_00000001;
        local_b8._8_8_ = ";";
        cmStrCat<std::__cxx11::string>
                  (&local_50,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,&local_d8);
        std::__cxx11::string::operator=((string *)source,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
    }
    local_108._0_8_ = &DAT_00000006;
    local_108._8_8_ = "CMAKE_";
    local_b8._8_8_ = (language->_M_dataplus)._M_p;
    local_b8._0_8_ = language->_M_string_length;
    cmStrCat<char[28]>(&local_88,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,
                       (char (*) [28])"_COMPILE_OPTIONS_CREATE_PCH");
    local_108._8_8_ = *(undefined8 *)(_Var2._M_node + 2);
    local_108._0_8_ = _Var2._M_node[2]._M_parent;
    local_b8._0_8_ = &DAT_00000001;
    local_b8._8_8_ = ";";
    psVar3 = cmMakefile::GetSafeDefinition(this->Makefile,&local_88);
    cmStrCat<std::__cxx11::string>(&local_d8,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,psVar3);
    std::__cxx11::string::operator=((string *)source,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    config_00 = local_58;
    psVar3 = local_68;
    GetPchHeader((string *)local_108,this,local_58,language,local_68);
    __return_storage_ptr__ = local_60;
    GetPchFile((string *)local_b8,this,config_00,language,psVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"<PCH_HEADER>",(allocator<char> *)&local_50);
    cmsys::SystemTools::ReplaceString((string *)source,&local_d8,(string *)local_108);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"<PCH_FILE>",(allocator<char> *)&local_50);
    cmsys::SystemTools::ReplaceString((string *)source,&local_d8,(string *)local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(_Var2._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchCreateCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchCreateCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& createOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      createOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    if (this->GetPropertyAsBool("PCH_INSTANTIATE_TEMPLATES")) {
      std::string varName = cmStrCat(
        "CMAKE_", language, "_COMPILE_OPTIONS_INSTANTIATE_TEMPLATES_PCH");
      std::string instantiateOption =
        this->Makefile->GetSafeDefinition(varName);
      if (!instantiateOption.empty()) {
        createOptionList = cmStrCat(createOptionList, ";", instantiateOption);
      }
    }

    const std::string createOptVar =
      cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_CREATE_PCH");

    createOptionList = cmStrCat(
      createOptionList, ";", this->Makefile->GetSafeDefinition(createOptVar));

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(createOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(createOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}